

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

int chirc_ctx_load_network(chirc_ctx_t *ctx,char *file,char *servername)

{
  int iVar1;
  FILE *__stream;
  __ssize_t _Var2;
  sds pcVar3;
  size_t len_00;
  sds *ppcVar4;
  chirc_server_t *pcVar5;
  char *pcVar6;
  char *l;
  int count;
  size_t len;
  
  l = (char *)0x0;
  len = 0;
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    pcVar6 = "Could not read file %s\n";
    servername = file;
  }
  else {
    while (_Var2 = getline(&l,&len,__stream), _Var2 != -1) {
      pcVar3 = sdsnew(l);
      pcVar3 = sdstrim(pcVar3," \r\n");
      len_00 = sdslen(pcVar3);
      ppcVar4 = sdssplitlen(pcVar3,len_00,",",1,&count);
      if (count != 4) {
        pcVar6 = "Invalid line in network file: %s";
        servername = pcVar3;
        goto LAB_00105c0d;
      }
      pcVar6 = *ppcVar4;
      pcVar5 = chirc_ctx_get_server(ctx,pcVar6);
      if (pcVar5 != (chirc_server_t *)0x0) {
        pcVar6 = "Network file contains duplicate server name: %s";
        servername = pcVar5->servername;
        goto LAB_00105c0d;
      }
      pcVar5 = (chirc_server_t *)calloc(1,0x68);
      pcVar5->servername = pcVar6;
      pcVar5->hostname = ppcVar4[1];
      pcVar5->port = ppcVar4[2];
      pcVar5->passwd = ppcVar4[3];
      pcVar5->conn = (chirc_connection_t *)0x0;
      chirc_ctx_add_server(ctx,pcVar5);
      iVar1 = strcmp(pcVar5->servername,servername);
      if (iVar1 == 0) {
        (ctx->network).this_server = pcVar5;
      }
    }
    fclose(__stream);
    free(l);
    if ((ctx->network).this_server != (chirc_server_t *)0x0) {
      return 0;
    }
    pcVar6 = "Network file does not include an entry for %s";
  }
LAB_00105c0d:
  serverlog(CRITICAL,(chirc_connection_t *)0x0,pcVar6,servername);
  return -1;
}

Assistant:

int chirc_ctx_load_network(chirc_ctx_t *ctx, char *file, char *servername)
{
    FILE *fp;
    char *l = NULL;
    size_t len = 0;
    ssize_t read;

    fp = fopen(file, "r");
    if (fp == NULL)
    {
        serverlog(CRITICAL, NULL, "Could not read file %s\n", file);
        return CHIRC_FAIL;
    }

    while ((read = getline(&l, &len, fp)) != -1)
    {
        sds line = sdsnew(l);
        line = sdstrim(line, " \r\n");
        sds *tokens;
        int count;

        tokens = sdssplitlen(line, sdslen(line),",",1, &count);

        if (count != 4)
        {
            serverlog(CRITICAL, NULL, "Invalid line in network file: %s", line);
            return CHIRC_FAIL;
        }

        chirc_server_t *ns;

        ns = chirc_ctx_get_server(ctx, tokens[0]);

        if (ns)
        {
            serverlog(CRITICAL, NULL, "Network file contains duplicate server name: %s", ns->servername);
            return CHIRC_FAIL;
        }

        ns = calloc(1, sizeof(chirc_server_t));

        ns->servername = tokens[0];
        ns->hostname = tokens[1];
        ns->port = tokens[2];
        ns->passwd = tokens[3];
        ns->conn = NULL;

        chirc_ctx_add_server(ctx, ns);

        if (strcmp(ns->servername, servername) == 0)
        {
            ctx->network.this_server = ns;
        }
    }

    fclose(fp);
    free(l);

    if (ctx->network.this_server == NULL)
    {
        serverlog(CRITICAL, NULL, "Network file does not include an entry for %s", servername);
        return CHIRC_FAIL;
    }

    return CHIRC_OK;
}